

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O2

int __thiscall CGlyphMap::CAtlas::TrySection(CAtlas *this,int Index,int Width,int Height)

{
  int iVar1;
  vector3_base<int> *pvVar2;
  long lVar3;
  int iVar4;
  anon_union_4_4_d826a04f_for_vector3_base<int>_5 *paVar5;
  
  pvVar2 = (this->m_Sections).list;
  lVar3 = (long)Index;
  iVar4 = -1;
  if (pvVar2[lVar3].field_0.x + Width < this->m_Width) {
    iVar4 = pvVar2[lVar3].field_1.y;
    paVar5 = &pvVar2[lVar3].field_2;
    for (; (lVar3 < (this->m_Sections).num_elements && (0 < Width)); Width = Width - iVar1) {
      if (iVar4 < ((anon_union_4_3_4e90b0cd_for_vector3_base<int>_3 *)(paVar5 + -1))->y) {
        iVar4 = ((anon_union_4_3_4e90b0cd_for_vector3_base<int>_3 *)(paVar5 + -1))->y;
      }
      if (this->m_Height <= iVar4 + Height) {
        return -1;
      }
      iVar1 = paVar5->z;
      lVar3 = lVar3 + 1;
      paVar5 = paVar5 + 3;
    }
  }
  return iVar4;
}

Assistant:

int CGlyphMap::CAtlas::TrySection(int Index, int Width, int Height)
{
	ivec3 Section = m_Sections[Index];
	int CurX = Section.x;
	int CurY = Section.y;

	int FitWidth = Width;

	if(CurX + Width > m_Width - 1)
		return -1;

	for(int i = Index; i < m_Sections.size(); ++i)
	{
		if(FitWidth <= 0)
			break;

		Section = m_Sections[i];
		if(Section.y > CurY)
			CurY = Section.y;
		if(CurY + Height > m_Height - 1)
			return -1;
		FitWidth -= Section.l;
	}

	return CurY;
}